

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

void Acec_MoveDuplicates(Vec_Wec_t *vLits,Vec_Wec_t *vClasses)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vClasses_00;
  int i;
  uint uVar4;
  int Class;
  int local_54;
  
  local_54 = 0;
  uVar4 = 0;
  do {
    if ((vLits->nSize <= local_54) ||
       (p = Vec_WecEntry(vLits,local_54), local_54 == vLits->nSize + -1)) {
      printf("Moved %d pairs of PPs to normalize the matrix.\n",(ulong)uVar4);
      return;
    }
    p_00 = Vec_WecEntry(vClasses,local_54);
    iVar2 = p->nSize;
    if (iVar2 != p_00->nSize) {
      __assert_fail("Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                    ,0x148,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
    }
    local_54 = local_54 + 1;
    Class = -1;
    for (i = 0; i < iVar2; i = i + 1) {
      iVar1 = Vec_IntEntry(p_00,i);
      if (Class == iVar1) {
        iVar2 = Vec_IntEntry(p,i);
        Vec_IntDrop(p,i);
        Vec_IntDrop(p_00,i);
        Vec_IntDrop(p,i + -1);
        Vec_IntDrop(p_00,i + -1);
        pVVar3 = Vec_WecEntry(vLits,local_54);
        vClasses_00 = Vec_WecEntry(vClasses,local_54);
        Vec_IntInsertOrder(pVVar3,vClasses_00,iVar2,Class);
        if (p->nSize != p_00->nSize) {
          __assert_fail("Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                        ,0x15c,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
        }
        pVVar3 = Vec_WecEntry(vLits,local_54);
        iVar2 = pVVar3->nSize;
        pVVar3 = Vec_WecEntry(vClasses,local_54);
        if (iVar2 != pVVar3->nSize) {
          __assert_fail("Vec_IntSize(Vec_WecEntry(vLits, i+1)) == Vec_IntSize(Vec_WecEntry(vClasses, i+1))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                        ,0x15d,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
        }
        i = i + -2;
        uVar4 = uVar4 + 1;
        iVar1 = -1;
      }
      iVar2 = p_00->nSize;
      Class = iVar1;
    }
  } while( true );
}

Assistant:

void Acec_MoveDuplicates( Vec_Wec_t * vLits, Vec_Wec_t * vClasses )
{
    Vec_Int_t * vLevel1, * vLevel2; 
    int i, k, Prev, This, Entry, Counter = 0;
    Vec_WecForEachLevel( vLits, vLevel1, i )
    {
        if ( i == Vec_WecSize(vLits) - 1 )
            break;
        vLevel2 = Vec_WecEntry(vClasses, i);
        assert( Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2) );
        Prev = -1;
        Vec_IntForEachEntry( vLevel2, This, k )
        {
            if ( Prev != This )
            {
                Prev = This;
                continue;
            }
            Prev = -1;
            Entry = Vec_IntEntry( vLevel1, k );

            Vec_IntDrop( vLevel1, k );
            Vec_IntDrop( vLevel2, k-- );

            Vec_IntDrop( vLevel1, k );
            Vec_IntDrop( vLevel2, k-- );

            Vec_IntInsertOrder( Vec_WecEntry(vLits, i+1), Vec_WecEntry(vClasses, i+1), Entry, This );

            assert( Vec_IntSize(vLevel1)                  == Vec_IntSize(vLevel2) );
            assert( Vec_IntSize(Vec_WecEntry(vLits, i+1)) == Vec_IntSize(Vec_WecEntry(vClasses, i+1)) );
            Counter++;
        }
    }
    printf( "Moved %d pairs of PPs to normalize the matrix.\n", Counter );
}